

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
i2p::sam::Session::StreamAccept(Session *this)

{
  long lVar1;
  bool bVar2;
  Reply *this_00;
  runtime_error *this_01;
  _Head_base<0UL,_Sock_*,_false> in_RDI;
  long in_FS_OFFSET;
  string *result;
  Reply *reply;
  unique_ptr<Sock,_std::default_delete<Sock>_> *sock;
  Reply *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *key;
  Session *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 local_101 [144];
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffff90;
  Sock *in_stack_ffffffffffffff98;
  Session *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = (string *)in_RDI._M_head_impl;
  Hello(in_stack_fffffffffffffeb0);
  this_00 = (Reply *)std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                               ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                                in_stack_fffffffffffffe78);
  tinyformat::format<std::__cxx11::string>((char *)in_RDI._M_head_impl,in_stack_fffffffffffffe90);
  SendRequestAndGetReply
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (bool)in_stack_ffffffffffffff8f);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe68->full);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),(char *)this_00,
             (allocator<char> *)key);
  Reply::Get(this_00,key);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe68->full);
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  bVar2 = std::operator==(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  if (bVar2) {
    std::__cxx11::string::~string(&in_stack_fffffffffffffe68->full);
    Reply::~Reply(in_stack_fffffffffffffe68);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (tuple<Sock_*,_std::default_delete<Sock>_>)in_RDI._M_head_impl;
    }
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    if (bVar2) {
      Disconnect((Session *)in_RDI._M_head_impl);
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>((char *)in_RDI._M_head_impl,args);
    std::runtime_error::runtime_error(this_01,(string *)(local_101 + 1));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Session::StreamAccept()
{
    auto sock = Hello();

    const Reply& reply = SendRequestAndGetReply(
        *sock, strprintf("STREAM ACCEPT ID=%s SILENT=false", m_session_id), false);

    const std::string& result = reply.Get("RESULT");

    if (result == "OK") {
        return sock;
    }

    if (result == "INVALID_ID") {
        // If our session id is invalid, then force session re-creation on next usage.
        Disconnect();
    }

    throw std::runtime_error(strprintf("\"%s\"", reply.full));
}